

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  DecodeStatus In;
  uint uVar4;
  MCInst *in_RCX;
  uint16_t in_SI;
  MCInst *in_RDI;
  uint imm;
  uint dst;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_2(in_SI,8,3);
  uVar2 = fieldFromInstruction_2(in_SI,0,8);
  uVar3 = (uint)uVar2;
  In = DecodetGPRRegisterClass
                 (in_RCX,local_4,(ulong)CONCAT24(uVar2,in_stack_ffffffffffffffc8),(void *)0x29269e);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    uVar4 = MCInst_getOpcode(in_RDI);
    if (uVar4 == 0xa8d) {
      MCOperand_CreateReg0(in_RDI,0xc);
    }
    else if (uVar4 != 0xa93) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned dst = fieldFromInstruction_2(Insn, 8, 3);
	unsigned imm = fieldFromInstruction_2(Insn, 0, 8);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, dst, Address, Decoder)))
		return MCDisassembler_Fail;

	switch(MCInst_getOpcode(Inst)) {
		default:
			return MCDisassembler_Fail;
		case ARM_tADR:
			break; // tADR does not explicitly represent the PC as an operand.
		case ARM_tADDrSPi:
			MCOperand_CreateReg0(Inst, ARM_SP);
			break;
	}

	MCOperand_CreateImm0(Inst, imm);
	return S;
}